

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_engine.hpp
# Opt level: O3

void cppurses::detail::Event_engine::send_all_deletes(Event_queue *queue)

{
  Move_iterator *this;
  Widget *receiver;
  Size_t SVar1;
  Size_t SVar2;
  pointer *__ptr;
  Move_iterator __begin2;
  Move_iterator __end2;
  undefined1 local_b8 [16];
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  local_a8;
  Size_t local_70;
  Mutex_t *local_68;
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  local_60;
  Event_queue *local_30;
  undefined8 local_28;
  
  this = (Move_iterator *)(local_b8 + 8);
  Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::Move_iterator(this,queue);
  local_68 = &queue->mtx_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_30 = queue;
  while( true ) {
    SVar1 = local_70;
    SVar2 = Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::size(this);
    if (SVar1 == SVar2) break;
    Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::remove
              ((Move_iterator *)local_b8,(char *)this);
    receiver = *(Widget **)(local_b8._0_8_ + 0x10);
    System::send_event((Event *)local_b8._0_8_);
    Event_queue::remove_events_of(queue,receiver);
    if ((Event *)local_b8._0_8_ != (Event *)0x0) {
      (*(*(_func_int ***)local_b8._0_8_)[1])();
    }
    local_70 = Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::find_next(this,local_70)
    ;
  }
  std::
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  ::~_Rb_tree(&local_a8);
  return;
}

Assistant:

static auto send_all_deletes(Event_queue& queue) -> void
    {
        auto view = Event_queue::View<Event::Delete>{queue};
        for (std::unique_ptr<Event> event : view) {
            Widget* receiver = &(event->receiver());
            System::send_event(*event);
            queue.remove_events_of(receiver);
        }
    }